

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

void mp_clear(mp_int *a)

{
  int *in_RDI;
  int i;
  int local_c;
  
  if (*(long *)(in_RDI + 4) != 0) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 4) + (long)local_c * 8) = 0;
    }
    free(*(void **)(in_RDI + 4));
    in_RDI[4] = 0;
    in_RDI[5] = 0;
    *in_RDI = 0;
    in_RDI[1] = 0;
    in_RDI[2] = 0;
  }
  return;
}

Assistant:

void mp_clear (mp_int * a)
{
  int i;

  /* only do anything if a hasn't been freed previously */
  if (a->dp != NULL) {
    /* first zero the digits */
    for (i = 0; i < a->used; i++) {
        a->dp[i] = 0;
    }

    /* free ram */
    XFREE(a->dp);

    /* reset members to make debugging easier */
    a->dp    = NULL;
    a->alloc = a->used = 0;
    a->sign  = MP_ZPOS;
  }
}